

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::disableFeature
          (COpenGLDriver *this,E_VIDEO_DRIVER_FEATURE feature,bool flag)

{
  bool bVar1;
  uint uVar2;
  byte in_DL;
  E_VIDEO_DRIVER_FEATURE in_ESI;
  CNullDriver *in_RDI;
  
  CNullDriver::disableFeature(in_RDI,in_ESI,(bool)(in_DL & 1));
  if (in_ESI == EVDF_TEXTURE_CUBEMAP_SEAMLESS) {
    uVar2 = (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[2])(in_RDI,0x25);
    if ((uVar2 & 1) == 0) {
      bVar1 = COpenGLExtensionHandler::queryFeature
                        ((COpenGLExtensionHandler *)&in_RDI->field_0x498,
                         EVDF_TEXTURE_CUBEMAP_SEAMLESS);
      if (bVar1) {
        glDisable(0x884f);
      }
    }
    else {
      glEnable(0x884f);
    }
  }
  return;
}

Assistant:

void COpenGLDriver::disableFeature(E_VIDEO_DRIVER_FEATURE feature, bool flag)
{
	CNullDriver::disableFeature(feature, flag);

	if (feature == EVDF_TEXTURE_CUBEMAP_SEAMLESS) {
		if (queryFeature(feature))
			glEnable(GL_TEXTURE_CUBE_MAP_SEAMLESS);
		else if (COpenGLExtensionHandler::queryFeature(feature))
			glDisable(GL_TEXTURE_CUBE_MAP_SEAMLESS);
	}
}